

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O1

void P_AlignPlane(sector_t *sec,line_t *line,int which)

{
  vertex_t *pvVar1;
  bool bVar2;
  vertex_t *pvVar3;
  sector_t *psVar4;
  line_t **pplVar5;
  uint uVar6;
  long lVar7;
  line_t *plVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  if (line->backsector != (sector_t *)0x0) {
    pplVar5 = sec->lines;
    pvVar3 = (*pplVar5)->v1;
    if (0 < sec->linecount) {
      dVar12 = 0.0;
      uVar6 = (uint)(ushort)sec->linecount * 2;
      do {
        if ((uVar6 & 1) == 0) {
          plVar8 = *pplVar5;
        }
        else {
          plVar8 = *pplVar5;
          pplVar5 = pplVar5 + 1;
          plVar8 = (line_t *)&plVar8->v2;
        }
        pvVar1 = plVar8->v1;
        dVar13 = ABS(((line->v1->p).Y - (pvVar1->p).Y) * (line->delta).X -
                     ((line->v1->p).X - (pvVar1->p).X) * (line->delta).Y);
        if (dVar13 <= dVar12) {
          dVar13 = dVar12;
          pvVar1 = pvVar3;
        }
        pvVar3 = pvVar1;
        dVar12 = dVar13;
        bVar2 = 1 < (int)uVar6;
        uVar6 = uVar6 - 1;
      } while (bVar2);
    }
    psVar4 = line->backsector;
    if (line->frontsector != sec) {
      psVar4 = line->frontsector;
    }
    lVar7 = 0xa8;
    if (which == 0) {
      lVar7 = 0x50;
    }
    dVar12 = *(double *)((long)&psVar4->planes[0].xform.xOffs + lVar7);
    dVar13 = (line->delta).X;
    dVar11 = (line->delta).Y;
    dVar14 = (pvVar3->p).X - (line->v1->p).X;
    dVar10 = (pvVar3->p).Y - (line->v1->p).Y;
    dVar9 = *(double *)((long)&sec->planes[0].xform.xOffs + lVar7) - dVar12;
    dVar15 = dVar9 * dVar11 - dVar10 * 0.0;
    dVar9 = dVar14 * 0.0 - dVar9 * dVar13;
    dVar11 = dVar10 * dVar13 - dVar11 * dVar14;
    dVar13 = c_sqrt(dVar11 * dVar11 + dVar9 * dVar9 + dVar15 * dVar15);
    lVar7 = 0xd8;
    dVar13 = (double)(~-(ulong)(dVar13 != 0.0) & (ulong)dVar13 |
                     (ulong)(1.0 / dVar13) & -(ulong)(dVar13 != 0.0));
    dVar15 = dVar15 * dVar13;
    dVar9 = dVar9 * dVar13;
    dVar13 = dVar13 * dVar11;
    if (((which == 0) && (lVar7 = 0xb0, dVar13 < 0.0)) || ((which == 1 && (0.0 < dVar13)))) {
      dVar15 = -dVar15;
      dVar9 = -dVar9;
      dVar13 = -dVar13;
    }
    dVar11 = (line->v1->p).X;
    dVar10 = (line->v1->p).Y;
    *(double *)((long)&sec->planes[0].xform.xOffs + lVar7) = dVar15;
    *(double *)((long)&sec->planes[0].xform.yOffs + lVar7) = dVar9;
    *(double *)((long)&sec->planes[0].xform.baseyOffs + lVar7) = dVar13;
    *(double *)((long)&sec->planes[0].xform.xScale + lVar7) =
         (-dVar15 * dVar11 - dVar10 * dVar9) - dVar12 * dVar13;
    *(double *)((long)&sec->planes[0].xform.yScale + lVar7) = -1.0 / dVar13;
  }
  return;
}

Assistant:

static void P_AlignPlane(sector_t *sec, line_t *line, int which)
{
	sector_t *refsec;
	double bestdist;
	vertex_t *refvert = (*sec->lines)->v1;	// Shut up, GCC
	int i;
	line_t **probe;

	if (line->backsector == NULL)
		return;

	// Find furthest vertex from the reference line. It, along with the two ends
	// of the line, will define the plane.
	bestdist = 0;
	for (i = sec->linecount * 2, probe = sec->lines; i > 0; i--)
	{
		double dist;
		vertex_t *vert;

		if (i & 1)
			vert = (*probe++)->v2;
		else
			vert = (*probe)->v1;
		dist = fabs((line->v1->fY() - vert->fY()) * line->Delta().X -
			(line->v1->fX() - vert->fX()) * line->Delta().Y);

		if (dist > bestdist)
		{
			bestdist = dist;
			refvert = vert;
		}
	}

	refsec = line->frontsector == sec ? line->backsector : line->frontsector;

	DVector3 p, v1, v2, cross;

	secplane_t *srcplane;
	double srcheight, destheight;

	srcplane = (which == 0) ? &sec->floorplane : &sec->ceilingplane;
	srcheight = (which == 0) ? sec->GetPlaneTexZ(sector_t::floor) : sec->GetPlaneTexZ(sector_t::ceiling);
	destheight = (which == 0) ? refsec->GetPlaneTexZ(sector_t::floor) : refsec->GetPlaneTexZ(sector_t::ceiling);

	p[0] = line->v1->fX();
	p[1] = line->v1->fY();
	p[2] = destheight;
	v1[0] = line->Delta().X;
	v1[1] = line->Delta().Y;
	v1[2] = 0;
	v2[0] = refvert->fX() - line->v1->fX();
	v2[1] = refvert->fY() - line->v1->fY();
	v2[2] = srcheight - destheight;

	cross = (v1 ^ v2).Unit();

	// Fix backward normals
	if ((cross.Z < 0 && which == 0) || (cross.Z > 0 && which == 1))
	{
		cross = -cross;
	}

	double dist = -cross[0] * line->v1->fX() - cross[1] * line->v1->fY() - cross[2] * destheight;
	srcplane->set(cross[0], cross[1], cross[2], dist);
}